

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseAssembler::embedLabelDelta(BaseAssembler *this,Label *label,Label *base,size_t dataSize)

{
  CodeHolder *this_00;
  long lVar1;
  Error EVar2;
  LabelEntry *pLVar3;
  LabelEntry *pLVar4;
  Expression *pEVar5;
  ulong uVar6;
  ulong n;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Error EStack_170;
  CodeWriter writer;
  StringTmp<256UL> sb;
  
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    EStack_170 = 5;
  }
  else {
    pLVar3 = CodeHolder::labelEntry(this_00,label);
    pLVar4 = CodeHolder::labelEntry((this->super_BaseEmitter)._code,base);
    if ((pLVar3 == (LabelEntry *)0x0) || (pLVar4 == (LabelEntry *)0x0)) {
      EStack_170 = 0xc;
    }
    else {
      n = (ulong)(((this->super_BaseEmitter)._environment._arch & 1) == 0) * 4 + 4;
      if (dataSize != 0) {
        n = dataSize;
      }
      if ((n < 9) &&
         (uVar6 = n - (n >> 1 & 0x5555555555555555),
         uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333),
         (byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2)) {
        writer._cursor = this->_bufferPtr;
        EVar2 = CodeWriter::ensureSpace(&writer,this,n);
        if (EVar2 == 0) {
          if ((this->super_BaseEmitter)._logger != (Logger *)0x0) {
            sb.super_String.field_0._large.data = sb._embeddedData;
            sb.super_String.field_0._large.size = 0;
            sb.super_String.field_0._0_8_ = 0x20;
            sb.super_String.field_0._large.capacity = 0x107;
            sb._embeddedData[0] = '\0';
            lVar1 = 0;
            if (n != 0) {
              for (; (n >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
              }
            }
            String::appendFormat<char_const(&)[4]>
                      (&sb.super_String,".%s (",(char (*) [4])(dataSizeByPowerTable + lVar1 * 4));
            Formatter::formatLabel
                      (&sb.super_String,0,&this->super_BaseEmitter,
                       (label->super_Operand).super_Operand_._baseId);
            String::append(&sb.super_String," - ",0xffffffffffffffff);
            Formatter::formatLabel
                      (&sb.super_String,0,&this->super_BaseEmitter,
                       (base->super_Operand).super_Operand_._baseId);
            String::append(&sb.super_String,")\n",0xffffffffffffffff);
            Logger::log((this->super_BaseEmitter)._logger,
                        (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
            String::reset(&sb.super_String);
          }
          if ((pLVar3->_section == (Section *)0x0) || (pLVar3->_section != pLVar4->_section)) {
            EVar2 = CodeHolder::newRelocEntry((this->super_BaseEmitter)._code,(RelocEntry **)&sb,1);
            if ((EVar2 != 0) ||
               (pEVar5 = Zone::newT<asmjit::Expression>(&((this->super_BaseEmitter)._code)->_zone),
               EVar2 = 1, pEVar5 == (Expression *)0x0)) {
              EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar2,(char *)0x0);
              return EVar2;
            }
            pEVar5->opType = '\0';
            pEVar5->valueType[0] = '\0';
            pEVar5->valueType[1] = '\0';
            pEVar5->reserved[0] = '\0';
            pEVar5->reserved[1] = '\0';
            pEVar5->reserved[2] = '\0';
            pEVar5->reserved[3] = '\0';
            pEVar5->reserved[4] = '\0';
            pEVar5->opType = '\x01';
            pEVar5->valueType[0] = '\x02';
            pEVar5->value[0].label = pLVar3;
            pEVar5->valueType[1] = '\x02';
            pEVar5->value[1].label = pLVar4;
            OffsetFormat::resetToDataValue((OffsetFormat *)(sb.super_String.field_0._0_8_ + 8),n);
            *(uint32_t *)(sb.super_String.field_0._0_8_ + 0x10) = this->_section->_id;
            *(long *)(sb.super_String.field_0._0_8_ + 0x18) =
                 (long)this->_bufferPtr - (long)this->_bufferData;
            *(Expression **)(sb.super_String.field_0._0_8_ + 0x20) = pEVar5;
            CodeWriter::emitZeros(&writer,n);
          }
          else {
            sb.super_String.field_0._0_8_ = pLVar3->_offset - pLVar4->_offset;
            CodeWriter::emitValueLE<unsigned_long>(&writer,(unsigned_long *)&sb,n);
          }
          CodeWriter::done(&writer,this);
          EVar2 = 0;
        }
        return EVar2;
      }
      EStack_170 = 0x34;
    }
  }
  EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,EStack_170,(char *)0x0);
  return EVar2;
}

Assistant:

Error BaseAssembler::embedLabelDelta(const Label& label, const Label& base, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  LabelEntry* labelEntry = _code->labelEntry(label);
  LabelEntry* baseEntry = _code->labelEntry(base);

  if (ASMJIT_UNLIKELY(!labelEntry || !baseEntry))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  if (dataSize == 0)
    dataSize = registerSize();

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(dataSize) || dataSize > 8))
    return reportError(DebugUtils::errored(kErrorInvalidOperandSize));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<256> sb;
    sb.appendFormat(".%s (", dataSizeByPowerTable[Support::ctz(dataSize)].str);
    Formatter::formatLabel(sb, 0, this, label.id());
    sb.append(" - ");
    Formatter::formatLabel(sb, 0, this, base.id());
    sb.append(")\n");
    _logger->log(sb);
  }
#endif

  // If both labels are bound within the same section it means the delta can be calculated now.
  if (labelEntry->isBound() && baseEntry->isBound() && labelEntry->section() == baseEntry->section()) {
    uint64_t delta = labelEntry->offset() - baseEntry->offset();
    writer.emitValueLE(delta, dataSize);
  }
  else {
    RelocEntry* re;
    Error err = _code->newRelocEntry(&re, RelocEntry::kTypeExpression);
    if (ASMJIT_UNLIKELY(err))
      return reportError(err);

    Expression* exp = _code->_zone.newT<Expression>();
    if (ASMJIT_UNLIKELY(!exp))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));

    exp->reset();
    exp->opType = Expression::kOpSub;
    exp->setValueAsLabel(0, labelEntry);
    exp->setValueAsLabel(1, baseEntry);

    re->_format.resetToDataValue(dataSize);
    re->_sourceSectionId = _section->id();
    re->_sourceOffset = offset();
    re->_payload = (uint64_t)(uintptr_t)exp;

    writer.emitZeros(dataSize);
  }

  writer.done(this);
  return kErrorOk;
}